

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O0

void nng_http_read(nng_http *conn,nng_aio *aio)

{
  nng_aio *aio_local;
  nng_http *conn_local;
  
  nni_http_read(conn,aio);
  return;
}

Assistant:

void
nng_http_read(nng_http *conn, nng_aio *aio)
{
#ifdef NNG_SUPP_HTTP
	nni_http_read(conn, aio);
#else
	NNI_ARG_UNUSED(conn);
	nni_aio_finish_error(aio, NNG_ENOTSUP);
#endif
}